

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

shared_ptr<mocker::ir::Reg> __thiscall
mocker::ir::dycGlobalReg(ir *this,shared_ptr<mocker::ir::Addr> *addr)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<mocker::ir::Reg> sVar2;
  shared_ptr<mocker::ir::Addr> local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  sVar2 = detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
                    (&local_20,(Reg *)addr);
  _Var1 = sVar2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if ((local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     (*(char *)local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
               _vptr_Addr != '@')) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    if (local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var1._M_pi = extraout_RDX;
    }
  }
  else {
    *(element_type **)this =
         local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) =
         local_20.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
  }
  sVar2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Reg>)
         sVar2.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Reg> dycGlobalReg(const std::shared_ptr<Addr> &addr) {
  auto reg = dyc<Reg>(addr);
  if (!reg || reg->getIdentifier()[0] != '@')
    return nullptr;
  return reg;
}